

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

char * userauth_list(LIBSSH2_SESSION *session,char *username,uint username_len)

{
  int iVar1;
  uint32_t uVar2;
  uchar *puVar3;
  char *pcVar4;
  uchar *puStack_40;
  int rc;
  uchar *s;
  ulong uStack_30;
  uint banner_len;
  unsigned_long methods_len;
  uchar reply_codes [4];
  uint username_len_local;
  char *username_local;
  LIBSSH2_SESSION *session_local;
  
  methods_len._0_4_ = 0x353334;
  methods_len._4_4_ = username_len;
  _reply_codes = username;
  if (session->userauth_list_state == libssh2_NB_state_idle) {
    memset(&session->userauth_list_packet_requirev_state,0,8);
    session->userauth_list_data_len = (ulong)(methods_len._4_4_ + 0x1b);
    puVar3 = (uchar *)(*session->alloc)(session->userauth_list_data_len,&session->abstract);
    session->userauth_list_data = puVar3;
    if (session->userauth_list_data == (uchar *)0x0) {
      puStack_40 = puVar3;
      _libssh2_error(session,-6,"Unable to allocate memory for userauth_list");
      return (char *)0x0;
    }
    puStack_40 = puVar3 + 1;
    *puVar3 = '2';
    _libssh2_store_str(&stack0xffffffffffffffc0,_reply_codes,(ulong)methods_len._4_4_);
    _libssh2_store_str(&stack0xffffffffffffffc0,"ssh-connection",0xe);
    _libssh2_store_u32(&stack0xffffffffffffffc0,4);
    session->userauth_list_state = libssh2_NB_state_created;
  }
  if (session->userauth_list_state == libssh2_NB_state_created) {
    iVar1 = _libssh2_transport_send
                      (session,session->userauth_list_data,session->userauth_list_data_len,
                       (uchar *)"none",4);
    if (iVar1 == -0x25) {
      _libssh2_error(session,-0x25,"Would block requesting userauth list");
      return (char *)0x0;
    }
    (*session->free)(session->userauth_list_data,&session->abstract);
    session->userauth_list_data = (uchar *)0x0;
    if (iVar1 != 0) {
      _libssh2_error(session,-7,"Unable to send userauth-none request");
      session->userauth_list_state = libssh2_NB_state_idle;
      return (char *)0x0;
    }
    session->userauth_list_state = libssh2_NB_state_sent;
  }
  if (session->userauth_list_state == libssh2_NB_state_sent) {
    iVar1 = _libssh2_packet_requirev
                      (session,(uchar *)&methods_len,&session->userauth_list_data,
                       &session->userauth_list_data_len,0,(uchar *)0x0,0,
                       &session->userauth_list_packet_requirev_state);
    if (iVar1 == -0x25) {
      _libssh2_error(session,-0x25,"Would block requesting userauth list");
      return (char *)0x0;
    }
    if ((iVar1 != 0) || (session->userauth_list_data_len == 0)) {
      _libssh2_error(session,iVar1,"Failed getting response");
      session->userauth_list_state = libssh2_NB_state_idle;
      return (char *)0x0;
    }
    if (*session->userauth_list_data == '5') {
      if (session->userauth_list_data_len < 5) {
        (*session->free)(session->userauth_list_data,&session->abstract);
        session->userauth_list_data = (uchar *)0x0;
        _libssh2_error(session,-0xe,"Unexpected packet size");
        return (char *)0x0;
      }
      s._4_4_ = _libssh2_ntohu32(session->userauth_list_data + 1);
      if (session->userauth_list_data_len - 5 < (ulong)s._4_4_) {
        (*session->free)(session->userauth_list_data,&session->abstract);
        session->userauth_list_data = (uchar *)0x0;
        _libssh2_error(session,-0x29,"Unexpected userauth banner size");
        return (char *)0x0;
      }
      pcVar4 = (char *)(*session->alloc)((long)s._4_4_ + 1,&session->abstract);
      session->userauth_banner = pcVar4;
      if (session->userauth_banner == (char *)0x0) {
        (*session->free)(session->userauth_list_data,&session->abstract);
        session->userauth_list_data = (uchar *)0x0;
        _libssh2_error(session,-6,"Unable to allocate memory for userauth_banner");
        return (char *)0x0;
      }
      memcpy(session->userauth_banner,session->userauth_list_data + 5,(ulong)s._4_4_);
      session->userauth_banner[s._4_4_] = '\0';
      (*session->free)(session->userauth_list_data,&session->abstract);
      session->userauth_list_data = (uchar *)0x0;
      methods_len._0_3_ = (uint3)(ushort)methods_len;
      iVar1 = _libssh2_packet_requirev
                        (session,(uchar *)&methods_len,&session->userauth_list_data,
                         &session->userauth_list_data_len,0,(uchar *)0x0,0,
                         &session->userauth_list_packet_requirev_state);
      if (iVar1 == -0x25) {
        _libssh2_error(session,-0x25,"Would block requesting userauth list");
        return (char *)0x0;
      }
      if ((iVar1 != 0) || (session->userauth_list_data_len == 0)) {
        _libssh2_error(session,iVar1,"Failed getting response");
        session->userauth_list_state = libssh2_NB_state_idle;
        return (char *)0x0;
      }
    }
    if (*session->userauth_list_data == '4') {
      _libssh2_error(session,0,"No error");
      (*session->free)(session->userauth_list_data,&session->abstract);
      session->userauth_list_data = (uchar *)0x0;
      session->state = session->state | 8;
      session->userauth_list_state = libssh2_NB_state_idle;
      return (char *)0x0;
    }
    if (session->userauth_list_data_len < 5) {
      (*session->free)(session->userauth_list_data,&session->abstract);
      session->userauth_list_data = (uchar *)0x0;
      _libssh2_error(session,-0xe,"Unexpected packet size");
      return (char *)0x0;
    }
    uVar2 = _libssh2_ntohu32(session->userauth_list_data + 1);
    uStack_30 = (ulong)uVar2;
    if (session->userauth_list_data_len - 5 <= uStack_30) {
      _libssh2_error(session,-0x29,"Unexpected userauth list size");
      return (char *)0x0;
    }
    memmove(session->userauth_list_data,session->userauth_list_data + 5,uStack_30);
    session->userauth_list_data[uStack_30] = '\0';
  }
  session->userauth_list_state = libssh2_NB_state_idle;
  return (char *)session->userauth_list_data;
}

Assistant:

static char *userauth_list(LIBSSH2_SESSION *session, const char *username,
                           unsigned int username_len)
{
    unsigned char reply_codes[4] =
        { SSH_MSG_USERAUTH_SUCCESS, SSH_MSG_USERAUTH_FAILURE,
          SSH_MSG_USERAUTH_BANNER, 0 };
    /* packet_type(1) + username_len(4) + service_len(4) +
       service(14)"ssh-connection" + method_len(4) = 27 */
    unsigned long methods_len;
    unsigned int banner_len;
    unsigned char *s;
    int rc;

    if(session->userauth_list_state == libssh2_NB_state_idle) {
        /* Zero the whole thing out */
        memset(&session->userauth_list_packet_requirev_state, 0,
               sizeof(session->userauth_list_packet_requirev_state));

        session->userauth_list_data_len = username_len + 27;

        s = session->userauth_list_data =
            LIBSSH2_ALLOC(session, session->userauth_list_data_len);
        if(!session->userauth_list_data) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for userauth_list");
            return NULL;
        }

        *(s++) = SSH_MSG_USERAUTH_REQUEST;
        _libssh2_store_str(&s, username, username_len);
        _libssh2_store_str(&s, "ssh-connection", 14);
        _libssh2_store_u32(&s, 4); /* send "none" separately */

        session->userauth_list_state = libssh2_NB_state_created;
    }

    if(session->userauth_list_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, session->userauth_list_data,
                                     session->userauth_list_data_len,
                                     (unsigned char *)"none", 4);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting userauth list");
            return NULL;
        }
        /* now free the packet that was sent */
        LIBSSH2_FREE(session, session->userauth_list_data);
        session->userauth_list_data = NULL;

        if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send userauth-none request");
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        session->userauth_list_state = libssh2_NB_state_sent;
    }

    if(session->userauth_list_state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_requirev(session, reply_codes,
                                      &session->userauth_list_data,
                                      &session->userauth_list_data_len, 0,
                                      NULL, 0,
                               &session->userauth_list_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting userauth list");
            return NULL;
        }
        else if(rc || (session->userauth_list_data_len < 1)) {
            _libssh2_error(session, rc, "Failed getting response");
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        if(session->userauth_list_data[0] == SSH_MSG_USERAUTH_BANNER) {
            if(session->userauth_list_data_len < 5) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                               "Unexpected packet size");
                return NULL;
            }
            banner_len = _libssh2_ntohu32(session->userauth_list_data + 1);
            if(banner_len > session->userauth_list_data_len - 5) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                               "Unexpected userauth banner size");
                return NULL;
            }
            session->userauth_banner = LIBSSH2_ALLOC(session, banner_len + 1);
            if(!session->userauth_banner) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for userauth_banner");
                return NULL;
            }
            memcpy(session->userauth_banner, session->userauth_list_data + 5,
                    banner_len);
            session->userauth_banner[banner_len] = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                           "Banner: %s",
                           session->userauth_banner));
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            /* SSH_MSG_USERAUTH_BANNER has been handled */
            reply_codes[2] = 0;
            rc = _libssh2_packet_requirev(session, reply_codes,
                                          &session->userauth_list_data,
                                          &session->userauth_list_data_len, 0,
                                          NULL, 0,
                                &session->userauth_list_packet_requirev_state);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block requesting userauth list");
                return NULL;
            }
            else if(rc || (session->userauth_list_data_len < 1)) {
                _libssh2_error(session, rc, "Failed getting response");
                session->userauth_list_state = libssh2_NB_state_idle;
                return NULL;
            }
        }

        if(session->userauth_list_data[0] == SSH_MSG_USERAUTH_SUCCESS) {
            /* Wow, who'dve thought... */
            _libssh2_error(session, LIBSSH2_ERROR_NONE, "No error");
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            session->state |= LIBSSH2_STATE_AUTHENTICATED;
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        if(session->userauth_list_data_len < 5) {
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "Unexpected packet size");
            return NULL;
        }

        methods_len = _libssh2_ntohu32(session->userauth_list_data + 1);
        if(methods_len >= session->userauth_list_data_len - 5) {
            _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                           "Unexpected userauth list size");
            return NULL;
        }

        /* Do note that the memory areas overlap! */
        memmove(session->userauth_list_data, session->userauth_list_data + 5,
                methods_len);
        session->userauth_list_data[methods_len] = '\0';
        _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                       "Permitted auth methods: %s",
                       session->userauth_list_data));
    }

    session->userauth_list_state = libssh2_NB_state_idle;
    return (char *)session->userauth_list_data;
}